

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O0

_Bool lore_is_fully_known(monster_race *race)

{
  monster_lore_conflict *lore_00;
  monster_lore_conflict *lore;
  uint i;
  monster_race *race_local;
  
  lore_00 = get_lore(race);
  if ((lore_00->all_known & 1U) == 0) {
    if ((lore_00->armour_known & 1U) == 0) {
      race_local._7_1_ = false;
    }
    else if (((lore_00->spell_freq_known & 1U) == 0) && (race->freq_innate + race->freq_spell != 0))
    {
      race_local._7_1_ = false;
    }
    else if ((lore_00->drop_known & 1U) == 0) {
      race_local._7_1_ = false;
    }
    else if ((lore_00->sleep_known & 1U) == 0) {
      race_local._7_1_ = false;
    }
    else {
      lore._4_4_ = 0;
      while ((lore._4_4_ < z_info->mon_blows_max &&
             (race->blow[lore._4_4_].method != (blow_method_conflict *)0x0))) {
        if ((lore_00->blow_known[lore._4_4_] & 1U) == 0) {
          return false;
        }
        lore._4_4_ = lore._4_4_ + 1;
      }
      for (lore._4_4_ = 0; lore._4_4_ < 0xb; lore._4_4_ = lore._4_4_ + 1) {
        if (lore_00->flags[lore._4_4_] == '\0') {
          return false;
        }
      }
      for (lore._4_4_ = 0; lore._4_4_ < 0xc; lore._4_4_ = lore._4_4_ + 1) {
        if (lore_00->spell_flags[lore._4_4_] != race->spell_flags[lore._4_4_]) {
          return false;
        }
      }
      lore_00->all_known = true;
      lore_update(race,lore_00);
      race_local._7_1_ = true;
    }
  }
  else {
    race_local._7_1_ = true;
  }
  return race_local._7_1_;
}

Assistant:

bool lore_is_fully_known(const struct monster_race *race)
{
	unsigned i;
	struct monster_lore *lore = get_lore(race);

	/* Check if already known */
	if (lore->all_known)
		return true;
		
	if (!lore->armour_known)
		return false;
	/* Only check spells if the monster can cast them */
	if (!lore->spell_freq_known && race->freq_innate + race->freq_spell)
		return false;
	if (!lore->drop_known)
		return false;
	if (!lore->sleep_known)
		return false;
		
	/* Check if blows are known */
	for (i = 0; i < z_info->mon_blows_max; i++){
		/* Only check if the blow exists */
		if (!race->blow[i].method)
			break;
		if (!lore->blow_known[i])
			return false;
		
	}
		
	/* Check all the flags */
	for (i = 0; i < RF_SIZE; i++)
		if (!lore->flags[i])
			return false;
		
		
	/* Check spell flags */
	for (i = 0; i < RSF_SIZE; i++)
		if (lore->spell_flags[i] != race->spell_flags[i])			
			return false;
	
	/* The player knows everything */
	lore->all_known = true;
	lore_update(race, lore);
	return true;
}